

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

any * __thiscall linb::any::operator=(any *this,any *rhs)

{
  any local_30;
  any *local_18;
  any *rhs_local;
  any *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  any(&local_30,rhs);
  swap(&local_30,this);
  ~any(&local_30);
  return this;
}

Assistant:

any& operator=(const any& rhs)
    {
        any(rhs).swap(*this);
        return *this;
    }